

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_cb.c
# Opt level: O0

void uo_cb_append_cb(uo_cb *cb,uo_cb *cb_after)

{
  uo_linklist *local_20;
  uo_linklist *link;
  uo_cb *cb_after_local;
  uo_cb *cb_local;
  
  uo_stack_insert_arr(&cb->stack,0,(cb_after->stack).items,(cb_after->stack).count);
  for (local_20 = (cb_after->funclist).next; local_20 != &cb_after->funclist;
      local_20 = local_20->next) {
    uo_cb_append_func(cb,(uo_cb_func)local_20[1].next);
  }
  return;
}

Assistant:

void uo_cb_append_cb(
    uo_cb *cb,
    uo_cb *cb_after)
{
    uo_stack_insert_arr(&cb->stack, 0, cb_after->stack.items, cb_after->stack.count);

    uo_linklist *link = cb_after->funclist.next;

    while (link != &cb_after->funclist)
    {
        uo_cb_append_func(cb, ((uo_cb_func_linklist *)link)->item);
        link = link->next;
    }
}